

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask sqlite3WhereExprListUsage(WhereMaskSet *pMaskSet,ExprList *pList)

{
  ulong uVar1;
  ExprList_item *pEVar2;
  long lVar3;
  Bitmask BVar4;
  
  if ((pList == (ExprList *)0x0) || (pList->nExpr < 1)) {
    BVar4 = 0;
  }
  else {
    pEVar2 = pList->a;
    lVar3 = 0;
    BVar4 = 0;
    do {
      if (pEVar2->pExpr == (Expr *)0x0) {
        uVar1 = 0;
      }
      else {
        uVar1 = sqlite3WhereExprUsageNN(pMaskSet,pEVar2->pExpr);
      }
      BVar4 = BVar4 | uVar1;
      lVar3 = lVar3 + 1;
      pEVar2 = pEVar2 + 1;
    } while (lVar3 < pList->nExpr);
  }
  return BVar4;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprListUsage(WhereMaskSet *pMaskSet, ExprList *pList){
  int i;
  Bitmask mask = 0;
  if( pList ){
    for(i=0; i<pList->nExpr; i++){
      mask |= sqlite3WhereExprUsage(pMaskSet, pList->a[i].pExpr);
    }
  }
  return mask;
}